

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  undefined1 *puVar1;
  error_handler eVar2;
  basic_format_specs<char> *pbVar3;
  byte bVar4;
  error_handler *this;
  type tVar5;
  uint uVar6;
  
  if (begin == end) {
    return begin;
  }
  this = (error_handler *)
         parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                   (begin,end,handler);
  if (this == (error_handler *)end) {
    return (char *)this;
  }
  eVar2 = *this;
  if (eVar2 == (error_handler)0x20) {
    tVar5 = (handler->checker_).arg_type_;
    uVar6 = tVar5 - int_type;
    if (10 < uVar6) goto LAB_0020a215;
    bVar4 = 0x30;
LAB_0020a14b:
    if ((uVar6 < 8) && ((char_type < tVar5 || ((0x10aU >> (tVar5 & 0x1f) & 1) == 0)))) {
      error_handler::on_error(this,"format specifier requires signed argument");
    }
    pbVar3 = (handler->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    pbVar3->field_0x9 = pbVar3->field_0x9 & 0x8f | bVar4;
    this = this + 1;
  }
  else {
    if (eVar2 == (error_handler)0x2d) {
      tVar5 = (handler->checker_).arg_type_;
      uVar6 = tVar5 - int_type;
      if (10 < uVar6) goto LAB_0020a215;
      bVar4 = 0x10;
      goto LAB_0020a14b;
    }
    if (eVar2 == (error_handler)0x2b) {
      tVar5 = (handler->checker_).arg_type_;
      uVar6 = tVar5 - int_type;
      if (10 < uVar6) goto LAB_0020a215;
      bVar4 = 0x20;
      goto LAB_0020a14b;
    }
  }
  if (this != (error_handler *)end) {
    if (*this == (error_handler)0x23) {
      if (10 < (handler->checker_).arg_type_ - int_type) goto LAB_0020a215;
      puVar1 = &((handler->
                 super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_)->field_0x9;
      *puVar1 = *puVar1 | 0x80;
      this = this + 1;
      if (this == (error_handler *)end) {
        return (char *)this;
      }
    }
    if (*this == (error_handler)0x30) {
      if (10 < (handler->checker_).arg_type_ - int_type) {
LAB_0020a215:
        error_handler::on_error(this,"format specifier requires numeric argument");
      }
      pbVar3 = (handler->
               super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar3->field_0x9 = pbVar3->field_0x9 & 0xf0 | 4;
      (((handler->
        super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->fill).data_[0] = '0';
      this = this + 1;
      if (this == (error_handler *)end) {
        return (char *)this;
      }
    }
    this = (error_handler *)
           parse_width<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                     ((char *)this,end,handler);
    if (this != (error_handler *)end) {
      if (*this == (error_handler)0x2e) {
        this = (error_handler *)
               parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                         ((char *)this,end,handler);
      }
      if ((this != (error_handler *)end) && (eVar2 = *this, eVar2 != (error_handler)0x7d)) {
        this = this + 1;
        ((handler->
         super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->type = (char)eVar2;
      }
    }
  }
  return (char *)this;
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end) return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (to_ascii(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}